

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

longlong mkvparser::Segment::CreateInstance(IMkvReader *pReader,longlong pos,Segment **pSegment)

{
  int iVar1;
  longlong lVar2;
  long lVar3;
  longlong lVar4;
  long lVar5;
  ulong uVar6;
  Segment *pSVar7;
  ulong uVar8;
  longlong total;
  long len;
  longlong available;
  ulong local_38;
  
  if (-1 < pos && pReader != (IMkvReader *)0x0) {
    *pSegment = (Segment *)0x0;
    iVar1 = (*pReader->_vptr_IMkvReader[1])(pReader,&total,&available);
    if (iVar1 < 0) {
      return (long)iVar1;
    }
    if ((ulong)available <= (ulong)total && -1 < available) {
      local_38 = 0xffffffffffffffff;
      while( true ) {
        if ((-1 < total) && (total <= pos)) {
          return -2;
        }
        lVar2 = GetUIntLength(pReader,pos,&len);
        if (lVar2 != 0) {
          return lVar2;
        }
        lVar3 = len + pos;
        if ((-1 < total) && (total < lVar3)) {
          return -2;
        }
        if (available < lVar3) {
          return lVar3;
        }
        lVar2 = ReadID(pReader,pos,&len);
        if (lVar2 < 0) {
          return -2;
        }
        lVar3 = len + pos;
        lVar4 = GetUIntLength(pReader,lVar3,&len);
        if (lVar4 != 0) {
          return lVar4;
        }
        lVar5 = len + lVar3;
        if ((-1 < total) && (total < lVar5)) break;
        if (available < lVar5) {
          return lVar5;
        }
        uVar6 = ReadUInt(pReader,lVar3,&len);
        if ((long)uVar6 < 0) {
          return uVar6;
        }
        lVar3 = lVar3 + len;
        uVar8 = -1L << ((char)len * '\a' & 0x3fU) ^ uVar6;
        if (lVar2 == 0x18538067) {
          if (((uVar8 != 0xffffffffffffffff) && (-1 < total)) &&
             (local_38 = 0xffffffffffffffff, (long)(uVar6 + lVar3) <= total)) {
            local_38 = uVar6;
          }
          pSVar7 = (Segment *)operator_new(200,(nothrow_t *)&std::nothrow);
          if (pSVar7 != (Segment *)0x0) {
            pSVar7->m_pReader = pReader;
            pSVar7->m_element_start = pos;
            pSVar7->m_start = lVar3;
            pSVar7->m_size = local_38;
            (pSVar7->m_eos).m_pSegment = (Segment *)0x0;
            (pSVar7->m_eos).m_element_start = 0;
            (pSVar7->m_eos).m_index = 0;
            (pSVar7->m_eos).m_pos = 0;
            (pSVar7->m_eos).m_element_size = 0;
            (pSVar7->m_eos).m_timecode = 0;
            (pSVar7->m_eos).m_entries = (BlockEntry **)0x0;
            (pSVar7->m_eos).m_entries_size = 0;
            (pSVar7->m_eos).m_entries_count = 0;
            pSVar7->m_pos = lVar3;
            pSVar7->m_pUnknownSize = (Cluster *)0x0;
            pSVar7->m_pSeekHead = (SeekHead *)0x0;
            pSVar7->m_pInfo = (SegmentInfo *)0x0;
            pSVar7->m_pTracks = (Tracks *)0x0;
            pSVar7->m_pCues = (Cues *)0x0;
            pSVar7->m_pChapters = (Chapters *)0x0;
            pSVar7->m_pTags = (Tags *)0x0;
            pSVar7->m_clusters = (Cluster **)0x0;
            pSVar7->m_clusterCount = 0;
            pSVar7->m_clusterPreloadCount = 0;
            pSVar7->m_clusterSize = 0;
          }
          *pSegment = pSVar7;
          return -(ulong)(pSVar7 == (Segment *)0x0);
        }
        if (uVar8 == 0xffffffffffffffff) {
          return -2;
        }
        pos = lVar3 + uVar6;
        if ((-1 < total) && (total < pos)) {
          return -2;
        }
        if (available < pos) {
          return pos;
        }
      }
      return -2;
    }
  }
  return -1;
}

Assistant:

long long Segment::CreateInstance(IMkvReader* pReader, long long pos,
                                  Segment*& pSegment) {
  if (pReader == NULL || pos < 0)
    return E_PARSE_FAILED;

  pSegment = NULL;

  long long total, available;

  const long status = pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  if (available < 0)
    return -1;

  if ((total >= 0) && (available > total))
    return -1;

  // I would assume that in practice this loop would execute
  // exactly once, but we allow for other elements (e.g. Void)
  // to immediately follow the EBML header.  This is fine for
  // the source filter case (since the entire file is available),
  // but in the splitter case over a network we should probably
  // just give up early.  We could for example decide only to
  // execute this loop a maximum of, say, 10 times.
  // TODO:
  // There is an implied "give up early" by only parsing up
  // to the available limit.  We do do that, but only if the
  // total file size is unknown.  We could decide to always
  // use what's available as our limit (irrespective of whether
  // we happen to know the total file length).  This would have
  // as its sense "parse this much of the file before giving up",
  // which a slightly different sense from "try to parse up to
  // 10 EMBL elements before giving up".

  for (;;) {
    if ((total >= 0) && (pos >= total))
      return E_FILE_FORMAT_INVALID;

    // Read ID
    long len;
    long long result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long idpos = pos;
    const long long id = ReadID(pReader, pos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    // Read Size

    result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return size;

    pos += len;  // consume length of size of element

    // Pos now points to start of payload

    // Handle "unknown size" for live streaming of webm files.
    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (id == libwebm::kMkvSegment) {
      if (size == unknown_size)
        size = -1;

      else if (total < 0)
        size = -1;

      else if ((pos + size) > total)
        size = -1;

      pSegment = new (std::nothrow) Segment(pReader, idpos, pos, size);
      if (pSegment == NULL)
        return E_PARSE_FAILED;

      return 0;  // success
    }

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && ((pos + size) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + size) > available)
      return pos + size;

    pos += size;  // consume payload
  }
}